

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O1

void __thiscall
Assimp::BaseImporter::GetExtensionList
          (BaseImporter *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *extensions)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  undefined4 extraout_var;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar3 = (*this->_vptr_BaseImporter[5])();
  if (CONCAT44(extraout_var,iVar3) == 0) {
    __assert_fail("desc != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                  ,0x90,"void Assimp::BaseImporter::GetExtensionList(std::set<std::string> &)");
  }
  pbVar6 = *(byte **)(CONCAT44(extraout_var,iVar3) + 0x38);
  if (pbVar6 != (byte *)0x0) {
    pbVar5 = pbVar6 + -1;
    pbVar7 = pbVar6;
    do {
      if ((*pbVar6 & 0xdf) == 0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pbVar7,pbVar6);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)extensions,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pbVar4 = pbVar5;
        if (pbVar6 == pbVar7 || (long)pbVar6 - (long)pbVar7 < 0) {
          __assert_fail("ext-last > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                        ,0x99,"void Assimp::BaseImporter::GetExtensionList(std::set<std::string> &)"
                       );
        }
        do {
          pbVar7 = pbVar4 + 1;
          pbVar1 = pbVar4 + 1;
          pbVar4 = pbVar7;
        } while (*pbVar1 == 0x20);
      }
      pbVar5 = pbVar5 + 1;
      bVar2 = *pbVar6;
      pbVar6 = pbVar6 + 1;
      if (bVar2 == 0) {
        return;
      }
    } while( true );
  }
  __assert_fail("ext != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                ,0x93,"void Assimp::BaseImporter::GetExtensionList(std::set<std::string> &)");
}

Assistant:

void BaseImporter::GetExtensionList(std::set<std::string>& extensions) {
    const aiImporterDesc* desc = GetInfo();
    ai_assert(desc != nullptr);

    const char* ext = desc->mFileExtensions;
    ai_assert(ext != nullptr );

    const char* last = ext;
    do {
        if (!*ext || *ext == ' ') {
            extensions.insert(std::string(last,ext-last));
            ai_assert(ext-last > 0);
            last = ext;
            while(*last == ' ') {
                ++last;
            }
        }
    }
    while(*ext++);
}